

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O3

void Extra_ThreshPrintInequalities
               (unsigned_long **pGreaters,unsigned_long **pSmallers,int nChows,int nInequalities)

{
  ulong uVar1;
  ulong uVar2;
  
  if (0 < nInequalities) {
    uVar2 = 0;
    do {
      printf("\n Inequality [%d] = ",uVar2 & 0xffffffff);
      if (nChows < 1) {
        printf(" > ");
      }
      else {
        uVar1 = 0;
        do {
          printf("%ld ",pGreaters[uVar2][uVar1]);
          uVar1 = uVar1 + 1;
        } while ((uint)nChows != uVar1);
        printf(" > ");
        if (0 < nChows) {
          uVar1 = 0;
          do {
            printf("%ld ",pSmallers[uVar2][uVar1]);
            uVar1 = uVar1 + 1;
          } while ((uint)nChows != uVar1);
        }
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)nInequalities);
  }
  return;
}

Assistant:

void Extra_ThreshPrintInequalities(unsigned long ** pGreaters,
        unsigned long ** pSmallers, int nChows, int nInequalities) {
    int i = 0, k = 0;
    for (k = 0; k < nInequalities; k++) {
        printf("\n Inequality [%d] = ", k);
        for (i = 0; i < nChows; i++) {
            printf("%ld ", pGreaters[k][i]);
        }
        printf(" > ");

        for (i = 0; i < nChows; i++) {
            printf("%ld ", pSmallers[k][i]);
        }
    }
}